

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

bool __thiscall QMakeEvaluator::isActiveConfig(QMakeEvaluator *this,QStringView config,bool regex)

{
  long lVar1;
  QStringView str;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  undefined1 uVar5;
  long lVar6;
  ProString *configValue;
  ProString *this_00;
  long in_FS_OFFSET;
  QRegularExpressionMatch local_70 [8];
  QArrayDataPointer<ProString> local_68;
  QRegularExpression re;
  QStringView config_local;
  
  config_local.m_data = config.m_data;
  config_local.m_size = config.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)QMakeInternal::statics._40_8_;
  local_68.ptr = (ProString *)QMakeInternal::statics._32_8_;
  bVar2 = comparesEqual(&config_local,(QStringView *)&local_68);
  uVar5 = 1;
  if (bVar2) goto LAB_001f8696;
  local_68.d = (Data *)QMakeInternal::statics._64_8_;
  local_68.ptr = (ProString *)QMakeInternal::statics._56_8_;
  bVar2 = comparesEqual(&config_local,(QStringView *)&local_68);
  if (!bVar2) {
    local_68.d = (Data *)QMakeInternal::statics._328_8_;
    local_68.ptr = (ProString *)QMakeInternal::statics._320_8_;
    bVar2 = comparesEqual(&config_local,(QStringView *)&local_68);
    if (bVar2) {
      uVar5 = this->m_hostBuild;
      goto LAB_001f8696;
    }
    if (regex) {
      bVar2 = QStringView::contains(&config_local,(QChar)0x2a,CaseSensitive);
      if (!bVar2) {
        bVar2 = QStringView::contains(&config_local,(QChar)0x3f,CaseSensitive);
        if (!bVar2) goto LAB_001f862f;
      }
      _re = 0xaaaaaaaaaaaaaaaa;
      QStringView::toString((QString *)&local_68,&config_local);
      QRegularExpression::fromWildcard(&re,local_68.size,local_68.ptr,0,0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
      QRegularExpression::match(&local_68,&re,&this->m_qmakespecName,0,0,0);
      cVar3 = QRegularExpressionMatch::hasMatch();
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_68);
      if (cVar3 == '\0') {
        local_68.size = -0x5555555555555556;
        local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_68.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
        values((ProStringList *)&local_68,this,(ProKey *)(QMakeInternal::statics + 0x48));
        lVar6 = local_68.size * 0x30;
        this_00 = local_68.ptr;
        do {
          if (lVar6 == 0) {
            QArrayDataPointer<ProString>::~QArrayDataPointer(&local_68);
            QRegularExpression::~QRegularExpression(&re);
            goto LAB_001f8484;
          }
          uVar4 = (long)this->m_toggle ^ 1;
          this->m_toggle = (int)uVar4;
          ProString::toQString(this_00,this->m_tmp + uVar4);
          QRegularExpression::match(local_70,&re,this->m_tmp + uVar4,0,0,0);
          cVar3 = QRegularExpressionMatch::hasMatch();
          QRegularExpressionMatch::~QRegularExpressionMatch(local_70);
          this_00 = this_00 + 1;
          lVar6 = lVar6 + -0x30;
        } while (cVar3 == '\0');
        QArrayDataPointer<ProString>::~QArrayDataPointer(&local_68);
      }
      QRegularExpression::~QRegularExpression(&re);
      goto LAB_001f8696;
    }
LAB_001f862f:
    local_68.ptr = (ProString *)(this->m_qmakespecName).d.ptr;
    local_68.d = (Data *)(this->m_qmakespecName).d.size;
    bVar2 = comparesEqual((QStringView *)&local_68,&config_local);
    if (bVar2) goto LAB_001f8696;
    values((ProStringList *)&local_68,this,(ProKey *)(QMakeInternal::statics + 0x48));
    str.m_data = config_local.m_data;
    str.m_size = config_local.m_size;
    bVar2 = ProStringList::contains((ProStringList *)&local_68,str,CaseSensitive);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_68);
    if (bVar2) goto LAB_001f8696;
  }
LAB_001f8484:
  uVar5 = 0;
LAB_001f8696:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeEvaluator::isActiveConfig(QStringView config, bool regex)
{
    // magic types for easy flipping
    if (config == statics.strtrue)
        return true;
    if (config == statics.strfalse)
        return false;

    if (config == statics.strhost_build)
        return m_hostBuild;

    if (regex && (config.contains(QLatin1Char('*')) || config.contains(QLatin1Char('?')))) {
        auto re = QRegularExpression::fromWildcard(config.toString());

        // mkspecs
        if (re.match(m_qmakespecName).hasMatch())
            return true;

        // CONFIG variable
        const auto configValues = values(statics.strCONFIG);
        for (const ProString &configValue : configValues) {
            ProStringRoUser u1(configValue, m_tmp[m_toggle ^= 1]);
            if (re.match(u1.str()).hasMatch())
                return true;
        }
    } else {
        // mkspecs
        if (m_qmakespecName == config)
            return true;

        // CONFIG variable
        if (values(statics.strCONFIG).contains(config))
            return true;
    }

    return false;
}